

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreFilter.hpp
# Opt level: O3

Range __thiscall cppjieba::PreFilter::Next(PreFilter *this)

{
  const_iterator pRVar1;
  const_iterator cVar2;
  const_iterator pRVar3;
  const_iterator __k;
  Range RVar4;
  
  pRVar1 = this->cursor_;
  pRVar3 = (this->sentence_).ptr_ + (this->sentence_).size_;
  __k = pRVar1;
  if (pRVar1 != pRVar3) {
    do {
      cVar2 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this->symbols_->_M_h,&__k->rune);
      pRVar3 = this->cursor_;
      if (cVar2.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
        if (pRVar1 == pRVar3) {
          pRVar3 = pRVar3 + 1;
          this->cursor_ = pRVar3;
        }
        break;
      }
      __k = pRVar3 + 1;
      this->cursor_ = __k;
      pRVar3 = (this->sentence_).ptr_ + (this->sentence_).size_;
    } while (__k != pRVar3);
  }
  RVar4.end = pRVar3;
  RVar4.begin = pRVar1;
  return RVar4;
}

Assistant:

Range Next() {
    Range range;
    range.begin = cursor_;
    while (cursor_ != sentence_.end()) {
      if (IsIn(symbols_, cursor_->rune)) {
        if (range.begin == cursor_) {
          cursor_ ++;
        }
        range.end = cursor_;
        return range;
      }
      cursor_ ++;
    }
    range.end = sentence_.end();
    return range;
  }